

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDefinition
          (EnumGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  EnumDescriptor *pEVar5;
  EnforceOptimizeMode EVar6;
  int number;
  cpp *this_00;
  EnumValueDescriptor *enum_value;
  char *pcVar7;
  EnumValueDescriptor *enum_value_00;
  EnumValueDescriptor *enum_value_01;
  long lVar8;
  char *pcVar9;
  long lVar10;
  cpp *this_01;
  Formatter format;
  Formatter format_value;
  string local_f0;
  cpp *local_d0;
  string local_c8;
  Formatter local_a8;
  cpp *local_70;
  undefined1 local_68 [56];
  
  local_a8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a8.vars_._M_t,&(this->variables_)._M_t);
  Formatter::operator()(&local_a8,"enum ${1$$classname$$}$ : int {\n",&this->descriptor_);
  io::Printer::Indent(local_a8.printer_);
  pEVar5 = this->descriptor_;
  this_00 = *(cpp **)(pEVar5 + 0x30);
  if (*(int *)(pEVar5 + 0x2c) < 1) {
    this_01 = this_00;
    if (*(int *)(*(long *)(pEVar5 + 0x10) + 0x3c) == 3) goto LAB_002c2469;
  }
  else {
    lVar8 = 0;
    lVar10 = 0;
    local_d0 = this_00;
    do {
      local_68._0_8_ = local_a8.printer_;
      local_70 = this_00;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_68 + 8),&local_a8.vars_._M_t);
      paVar1 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
      paVar2 = &local_c8.field_2;
      EnumValueName_abi_cxx11_
                (&local_c8,(cpp *)(*(long *)(this->descriptor_ + 0x30) + lVar8),enum_value);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_68,&local_f0,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"number","");
      Int32ToString_abi_cxx11_
                (&local_c8,
                 (cpp *)(ulong)*(uint *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar8),number)
      ;
      Formatter::Set<std::__cxx11::string>((Formatter *)local_68,&local_f0,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"deprecation","");
      cVar3 = *(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0x20 + lVar8) + 0x48);
      pcVar9 = "PROTOBUF_DEPRECATED ";
      if (cVar3 == '\0') {
        pcVar9 = "";
      }
      pcVar7 = pcVar9 + 0x14;
      if (cVar3 == '\0') {
        pcVar7 = pcVar9;
      }
      local_c8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar9,pcVar7);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_68,&local_f0,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (lVar8 != 0) {
        Formatter::operator()<>((Formatter *)local_68,",\n");
      }
      local_f0._M_dataplus._M_p = (pointer)(*(long *)(this->descriptor_ + 0x30) + lVar8);
      Formatter::operator()
                ((Formatter *)local_68,"${1$$prefix$$name$$}$ $deprecation$= $number$",
                 (EnumValueDescriptor **)&local_f0);
      iVar4 = *(int *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar8);
      this_01 = (cpp *)(*(long *)(this->descriptor_ + 0x30) + lVar8);
      this_00 = this_01;
      if (*(int *)(local_70 + 0x10) <= iVar4) {
        this_00 = local_70;
      }
      if (iVar4 <= *(int *)(local_d0 + 0x10)) {
        this_01 = local_d0;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_68 + 8));
      lVar10 = lVar10 + 1;
      iVar4 = *(int *)(this->descriptor_ + 0x2c);
      lVar8 = lVar8 + 0x28;
      local_d0 = this_01;
    } while (lVar10 < iVar4);
    if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
      if (0 < iVar4) {
        Formatter::operator()<>(&local_a8,",\n");
      }
LAB_002c2469:
      Formatter::operator()<>
                (&local_a8,
                 "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::min(),\n$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::max()"
                );
    }
  }
  io::Printer::Outdent(local_a8.printer_);
  Formatter::operator()<>(&local_a8,"\n};\n");
  EnumValueName_abi_cxx11_((string *)local_68,this_00,enum_value_00);
  EnumValueName_abi_cxx11_(&local_f0,this_01,enum_value_01);
  Formatter::operator()
            (&local_a8,
             "$dllexport_decl $bool $classname$_IsValid(int value);\nconstexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = $prefix$$2$;\nconstexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = $prefix$$3$;\n"
             ,&this->descriptor_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,&local_f0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((Printer *)local_68._0_8_ != (Printer *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  if (this->generate_array_size_ == true) {
    Formatter::operator()
              (&local_a8,
               "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = $prefix$$short_name$_MAX + 1;\n\n"
               ,&this->descriptor_);
  }
  EVar6 = this->options_->enforce_mode;
  if (EVar6 == kSpeed) {
LAB_002c2545:
    Formatter::operator()<>
              (&local_a8,
               "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* $classname$_descriptor();\n");
    EVar6 = this->options_->enforce_mode;
LAB_002c255d:
    if ((EVar6 == kSpeed) ||
       ((EVar6 != kLiteRuntime &&
        (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) != 3))))
    goto LAB_002c258f;
  }
  else if (EVar6 != kLiteRuntime) {
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) != 3)
    goto LAB_002c2545;
    goto LAB_002c255d;
  }
  Formatter::operator()<>(&local_a8,"const std::string& $classname$_Name($classname$ value);\n");
LAB_002c258f:
  Formatter::operator()<>
            (&local_a8,
             "template<typename T>\ninline const std::string& $classname$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $classname$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $classname$_Name.\");\n"
            );
  EVar6 = this->options_->enforce_mode;
  pcVar9 = 
  "  return ::$proto_ns$::internal::NameOfEnum(\n    $classname$_descriptor(), enum_t_value);\n";
  if ((EVar6 != kSpeed) &&
     ((EVar6 == kLiteRuntime ||
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) == 3)))) {
    pcVar9 = "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n";
  }
  Formatter::operator()<>(&local_a8,pcVar9);
  Formatter::operator()<>(&local_a8,"}\n");
  EVar6 = this->options_->enforce_mode;
  pcVar9 = 
  "inline bool $classname$_Parse(\n    const std::string& name, $classname$* value) {\n  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n    $classname$_descriptor(), name, value);\n}\n"
  ;
  if ((EVar6 != kSpeed) &&
     ((EVar6 == kLiteRuntime ||
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) == 3)))) {
    pcVar9 = "bool $classname$_Parse(\n    const std::string& name, $classname$* value);\n";
  }
  Formatter::operator()<>(&local_a8,pcVar9);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateDefinition(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("enum ${1$$classname$$}$ : int {\n", descriptor_);
  format.Indent();

  const EnumValueDescriptor* min_value = descriptor_->value(0);
  const EnumValueDescriptor* max_value = descriptor_->value(0);

  for (int i = 0; i < descriptor_->value_count(); i++) {
    auto format_value = format;
    format_value.Set("name", EnumValueName(descriptor_->value(i)));
    // In C++, an value of -2147483648 gets interpreted as the negative of
    // 2147483648, and since 2147483648 can't fit in an integer, this produces a
    // compiler warning.  This works around that issue.
    format_value.Set("number", Int32ToString(descriptor_->value(i)->number()));
    format_value.Set(
        "deprecation",
        DeprecatedAttribute(options_,
                            descriptor_->value(i)->options().deprecated()));

    if (i > 0) format_value(",\n");
    format_value("${1$$prefix$$name$$}$ $deprecation$= $number$",
                 descriptor_->value(i));

    if (descriptor_->value(i)->number() < min_value->number()) {
      min_value = descriptor_->value(i);
    }
    if (descriptor_->value(i)->number() > max_value->number()) {
      max_value = descriptor_->value(i);
    }
  }

  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // For new enum semantics: generate min and max sentinel values equal to
    // INT32_MIN and INT32_MAX
    if (descriptor_->value_count() > 0) format(",\n");
    format(
        "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::min(),\n"
        "$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::max()");
  }

  format.Outdent();
  format("\n};\n");

  format(
      "$dllexport_decl $bool $classname$_IsValid(int value);\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = "
      "$prefix$$2$;\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = "
      "$prefix$$3$;\n",
      descriptor_, EnumValueName(min_value), EnumValueName(max_value));

  if (generate_array_size_) {
    format(
        "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = "
        "$prefix$$short_name$_MAX + 1;\n\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* "
        "$classname$_descriptor();\n");
  }

  // The _Name and _Parse functions. The lite implementation is table-based, so
  // we make sure to keep the tables hidden in the .cc file.
  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    format("const std::string& $classname$_Name($classname$ value);\n");
  }
  // The _Name() function accepts the enum type itself but also any integral
  // type.
  format(
      "template<typename T>\n"
      "inline const std::string& $classname$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $classname$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $classname$_Name.\");\n");
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "  return ::$proto_ns$::internal::NameOfEnum(\n"
        "    $classname$_descriptor(), enum_t_value);\n");
  } else {
    format(
        "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n");
  }
  format("}\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "inline bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value) {\n"
        "  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n"
        "    $classname$_descriptor(), name, value);\n"
        "}\n");
  } else {
    format(
        "bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value);\n");
  }
}